

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.hpp
# Opt level: O0

void __thiscall
asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::basic_socket<asio::io_context>
          (basic_socket<asio::ip::udp,_asio::any_io_executor> *this,io_context *context,
          endpoint_type *endpoint,
          constraint_t<is_convertible<io_context_&,_execution_context_&>::value> param_4)

{
  service_type *psVar1;
  implementation_type *piVar2;
  sockaddr *in_RDX;
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>
  *in_RDI;
  protocol_type protocol;
  error_code ec;
  basic_endpoint<asio::ip::udp> *in_stack_ffffffffffffff48;
  error_code *in_stack_ffffffffffffff50;
  io_context *in_stack_ffffffffffffff70;
  undefined1 *puVar3;
  undefined8 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int local_44;
  undefined1 local_40 [40];
  sockaddr *local_18;
  
  local_18 = in_RDX;
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>::
  io_object_impl<asio::io_context>
            ((io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>
              *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(int)in_stack_ffffffffffffff78,
             in_stack_ffffffffffffff70);
  puVar3 = local_40;
  CLI::std::error_code::error_code((error_code *)in_stack_ffffffffffffff50);
  local_44 = (int)ip::basic_endpoint<asio::ip::udp>::protocol(in_stack_ffffffffffffff48);
  psVar1 = asio::detail::
           io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>
           ::get_service(in_RDI);
  piVar2 = asio::detail::
           io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>
           ::get_implementation(in_RDI);
  asio::detail::reactive_socket_service<asio::ip::udp>::open
            (psVar1,(char *)piVar2,(int)&local_44,puVar3);
  asio::detail::throw_error(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
  psVar1 = asio::detail::
           io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>
           ::get_service(in_RDI);
  piVar2 = asio::detail::
           io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>
           ::get_implementation(in_RDI);
  asio::detail::reactive_socket_service<asio::ip::udp>::bind
            (psVar1,(int)piVar2,local_18,(socklen_t)local_40);
  asio::detail::throw_error((error_code *)psVar1,(char *)in_stack_ffffffffffffff48);
  return;
}

Assistant:

basic_socket(ExecutionContext& context, const endpoint_type& endpoint,
      constraint_t<
        is_convertible<ExecutionContext&, execution_context&>::value
      > = 0)
    : impl_(0, 0, context)
  {
    asio::error_code ec;
    const protocol_type protocol = endpoint.protocol();
    impl_.get_service().open(impl_.get_implementation(), protocol, ec);
    asio::detail::throw_error(ec, "open");
    impl_.get_service().bind(impl_.get_implementation(), endpoint, ec);
    asio::detail::throw_error(ec, "bind");
  }